

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

void __thiscall
soplex::SPxMainSM<double>::DuplicateColsPS::execute
          (DuplicateColsPS *this,VectorBase<double> *x,VectorBase<double> *param_2,
          VectorBase<double> *param_3,VectorBase<double> *r,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *cStatus,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *rStatus,bool isOptimal)

{
  int iVar1;
  pointer pdVar2;
  int *piVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  uint uVar8;
  VarStatus VVar9;
  double *pdVar10;
  SPxInternalCodeException *pSVar11;
  VarStatus *pVVar12;
  pointer pdVar13;
  long lVar14;
  long lVar15;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar16;
  double eps;
  double eps_00;
  double eps_01;
  double eps_02;
  double eps_03;
  double eps_04;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double eps_05;
  double extraout_XMM0_Qa_07;
  double extraout_XMM0_Qa_08;
  double extraout_XMM0_Qa_09;
  double extraout_XMM0_Qa_10;
  double extraout_XMM0_Qa_11;
  double extraout_XMM0_Qa_12;
  double eps_06;
  double eps_07;
  double eps_08;
  double eps_09;
  double eps_10;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  undefined1 auVar21 [16];
  double dVar22;
  allocator local_a9;
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  undefined1 local_88 [16];
  string local_78;
  double local_58;
  ulong uStack_50;
  double local_48;
  ulong uStack_40;
  double local_30;
  
  if (this->m_isFirst != false) {
    return;
  }
  if (this->m_isLast == true) {
    uVar8 = (this->m_perm).thesize;
    pdVar13 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar2 = (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pVVar12 = cStatus->data;
    piVar3 = (this->m_perm).data;
    for (lVar15 = 0; 0 < (int)(uVar8 + (int)lVar15); lVar15 = lVar15 + -1) {
      lVar14 = (long)piVar3[(ulong)uVar8 + lVar15 + -1];
      if (-1 < lVar14) {
        pdVar13[(ulong)uVar8 + lVar15 + -1] = pdVar13[lVar14];
        pdVar2[(ulong)uVar8 + lVar15 + -1] = pdVar2[lVar14];
        pVVar12[(ulong)uVar8 + lVar15 + -1] = pVVar12[lVar14];
      }
    }
    return;
  }
  iVar1 = this->m_k;
  pVVar12 = cStatus->data;
  switch(pVVar12[iVar1]) {
  case ON_UPPER:
    pdVar13 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar13[iVar1] = this->m_upK;
    lVar15 = (long)this->m_j;
    if (this->m_scale <= 0.0) {
LAB_001f4cd3:
      dVar16 = this->m_loJ;
      pdVar13[lVar15] = dVar16;
      pVVar12[lVar15] = (dVar16 == this->m_upJ) + ON_LOWER;
      goto LAB_001f57fd;
    }
    break;
  case ON_LOWER:
    pdVar13 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar13[iVar1] = this->m_loK;
    lVar15 = (long)this->m_j;
    if (0.0 < this->m_scale) goto LAB_001f4cd3;
    break;
  case FIXED:
    lVar15 = (long)this->m_j;
    (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar15] = this->m_loJ;
LAB_001f5146:
    pVVar12[lVar15] = FIXED;
    goto LAB_001f57fd;
  case ZERO:
    local_a8 = this->m_loK;
    dStack_a0 = 0.0;
    (*(this->super_PostStep)._vptr_PostStep[7])(this);
    if (ABS(local_a8) <= extraout_XMM0_Qa_01) {
      local_a8 = this->m_upK;
      dStack_a0 = 0.0;
      (*(this->super_PostStep)._vptr_PostStep[7])(this);
      dVar16 = ABS(local_a8);
      local_a8 = this->m_loK;
      if (((extraout_XMM0_Qa_06 < dVar16) || (local_a8 != this->m_upK)) ||
         (NAN(local_a8) || NAN(this->m_upK))) goto LAB_001f5183;
      VVar9 = FIXED;
    }
    else {
      local_a8 = this->m_loK;
LAB_001f5183:
      dStack_a0 = 0.0;
      (*(this->super_PostStep)._vptr_PostStep[7])(this);
      if (ABS(local_a8) <= extraout_XMM0_Qa_02) {
        VVar9 = ON_LOWER;
      }
      else {
        local_a8 = this->m_upK;
        dStack_a0 = 0.0;
        (*(this->super_PostStep)._vptr_PostStep[7])(this);
        VVar9 = ON_UPPER;
        if (extraout_XMM0_Qa_03 < ABS(local_a8)) {
          local_a8 = this->m_loK;
          dStack_a0 = 0.0;
          (*(this->super_PostStep)._vptr_PostStep[7])(this);
          dVar16 = ABS(local_a8);
          if (dVar16 <= 0.0) {
            dVar16 = 0.0;
          }
          if (dVar16 <= 1.0) {
            dVar16 = 1.0;
          }
          if (extraout_XMM0_Qa_04 < local_a8 / dVar16) {
LAB_001f583d:
            pSVar11 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
            std::__cxx11::string::string
                      ((string *)&local_78,"XMAISM05 This should never happen.",&local_a9);
            SPxInternalCodeException::SPxInternalCodeException(pSVar11,&local_78);
            __cxa_throw(pSVar11,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
          }
          local_a8 = this->m_upK;
          dStack_a0 = 0.0;
          (*(this->super_PostStep)._vptr_PostStep[7])(this);
          dVar16 = ABS(local_a8);
          if (dVar16 <= 0.0) {
            dVar16 = 0.0;
          }
          if (dVar16 <= 1.0) {
            dVar16 = 1.0;
          }
          if (local_a8 / dVar16 <= -extraout_XMM0_Qa_05) goto LAB_001f583d;
          VVar9 = ZERO;
        }
      }
    }
    cStatus->data[this->m_k] = VVar9;
    (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[this->m_j] = 0.0;
    local_a8 = this->m_loJ;
    dStack_a0 = 0.0;
    (*(this->super_PostStep)._vptr_PostStep[7])(this);
    if (ABS(local_a8) <= extraout_XMM0_Qa_07) {
      local_a8 = this->m_upJ;
      dStack_a0 = 0.0;
      (*(this->super_PostStep)._vptr_PostStep[7])(this);
      dVar16 = ABS(local_a8);
      local_a8 = this->m_loJ;
      if (dVar16 <= extraout_XMM0_Qa_12) {
        if ((local_a8 == this->m_upJ) && (!NAN(local_a8) && !NAN(this->m_upJ))) {
          lVar15 = (long)this->m_j;
          pVVar12 = cStatus->data;
          goto LAB_001f5146;
        }
      }
    }
    else {
      local_a8 = this->m_loJ;
    }
    dStack_a0 = 0.0;
    (*(this->super_PostStep)._vptr_PostStep[7])(this);
    if (ABS(local_a8) <= extraout_XMM0_Qa_08) {
      lVar15 = (long)this->m_j;
      cStatus->data[lVar15] = ON_LOWER;
    }
    else {
      local_a8 = this->m_upJ;
      dStack_a0 = 0.0;
      (*(this->super_PostStep)._vptr_PostStep[7])(this);
      if (extraout_XMM0_Qa_09 < ABS(local_a8)) {
        local_a8 = this->m_loJ;
        dStack_a0 = 0.0;
        (*(this->super_PostStep)._vptr_PostStep[7])(this);
        dVar16 = ABS(local_a8);
        if (dVar16 <= 0.0) {
          dVar16 = 0.0;
        }
        if (dVar16 <= 1.0) {
          dVar16 = 1.0;
        }
        if (local_a8 / dVar16 <= extraout_XMM0_Qa_10) {
          local_a8 = this->m_upJ;
          dStack_a0 = 0.0;
          (*(this->super_PostStep)._vptr_PostStep[7])(this);
          dVar16 = ABS(local_a8);
          if (dVar16 <= 0.0) {
            dVar16 = 0.0;
          }
          if (dVar16 <= 1.0) {
            dVar16 = 1.0;
          }
          if (-extraout_XMM0_Qa_11 < local_a8 / dVar16) {
            lVar15 = (long)this->m_j;
            cStatus->data[lVar15] = ZERO;
            goto LAB_001f57fd;
          }
        }
        pSVar11 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&local_78,"XMAISM06 This should never happen.",&local_a9);
        SPxInternalCodeException::SPxInternalCodeException(pSVar11,&local_78);
        __cxa_throw(pSVar11,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
      }
      lVar15 = (long)this->m_j;
      cStatus->data[lVar15] = ON_UPPER;
    }
    goto LAB_001f57fd;
  case BASIC:
    local_48 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar1];
    local_98 = this->m_loK;
    dStack_90 = this->m_upK;
    uStack_40 = 0;
    auVar17._0_8_ = ABS(local_48);
    auVar17._8_8_ = ABS(local_48);
    auVar18._8_8_ = ABS(dStack_90);
    auVar18._0_8_ = ABS(local_98);
    auVar18 = maxpd(auVar17,auVar18);
    dVar16 = auVar18._8_8_;
    auVar4._8_8_ = -(ulong)(dVar16 < 1.0);
    auVar4._0_8_ = -(ulong)(auVar18._0_8_ < 1.0);
    uVar8 = movmskpd(iVar1,auVar4);
    local_a8 = 1.0;
    dStack_a0 = 0.0;
    local_88 = ZEXT816(0x3ff0000000000000);
    if ((uVar8 & 1) == 0) {
      local_88 = auVar18;
    }
    if ((uVar8 & 2) == 0) {
      local_a8 = dVar16;
      dStack_a0 = dVar16;
    }
    (*(this->super_PostStep)._vptr_PostStep[7])(this);
    local_58 = extraout_XMM0_Qa;
    (*(this->super_PostStep)._vptr_PostStep[7])(this);
    dVar16 = this->m_loJ;
    local_30 = extraout_XMM0_Qa_00;
    pdVar10 = (double *)infinity();
    if ((((dVar16 <= -*pdVar10) &&
         (dVar16 = this->m_upJ, pdVar10 = (double *)infinity(), *pdVar10 <= dVar16)) &&
        (dVar16 = this->m_loK, pdVar10 = (double *)infinity(), dVar16 <= -*pdVar10)) &&
       (dVar16 = this->m_upK, pdVar10 = (double *)infinity(), *pdVar10 <= dVar16)) {
      lVar15 = (long)this->m_j;
      cStatus->data[lVar15] = ZERO;
      (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar15] = 0.0;
      goto LAB_001f57fd;
    }
    auVar19._8_8_ = local_98;
    auVar19._0_8_ = local_48;
    auVar5._8_8_ = local_88._0_8_;
    auVar5._0_8_ = local_88._0_8_;
    auVar18 = divpd(auVar19,auVar5);
    dVar20 = auVar18._8_8_;
    dVar16 = auVar18._0_8_ - dVar20;
    auVar21._8_8_ = dStack_90;
    auVar21._0_8_ = local_48;
    auVar6._8_8_ = local_a8;
    auVar6._0_8_ = local_a8;
    auVar18 = divpd(auVar21,auVar6);
    dVar22 = auVar18._8_8_;
    local_48 = auVar18._0_8_ - dVar22;
    local_58 = (double)(~-(ulong)(ABS(dVar16) <= local_58) & (ulong)dVar16);
    uStack_50 = ~(ulong)ABS(dVar20) & (ulong)dVar20;
    local_48 = (double)(~-(ulong)(ABS(local_48) <= local_30) & (ulong)local_48);
    uStack_40 = ~(ulong)ABS(dVar22) & (ulong)dVar22;
    dVar16 = this->m_scale;
    dVar20 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[this->m_k];
    if (dVar16 <= 0.0) {
      local_98 = this->m_upK + dVar16 * this->m_loJ;
      (*(this->super_PostStep)._vptr_PostStep[7])(this);
      bVar7 = GErel<double,double,double>(dVar20,local_98,eps_05);
      if (!bVar7) {
        dVar16 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[this->m_k];
        local_98 = this->m_scale * this->m_loJ + this->m_loK;
        (*(this->super_PostStep)._vptr_PostStep[7])(this);
        bVar7 = GErel<double,double,double>(dVar16,local_98,eps_06);
        if ((!bVar7) || (dVar16 = this->m_loJ, pdVar10 = (double *)infinity(), dVar16 <= -*pdVar10))
        {
          dVar16 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[this->m_k];
          local_98 = this->m_scale * this->m_upJ + this->m_upK;
          (*(this->super_PostStep)._vptr_PostStep[7])(this);
          bVar7 = GErel<double,double,double>(dVar16,local_98,eps_07);
          if ((bVar7) && (dVar16 = this->m_upK, pdVar10 = (double *)infinity(), dVar16 < *pdVar10))
          goto LAB_001f55dc;
          dVar16 = this->m_scale;
          dVar20 = this->m_upJ;
          local_a8 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[this->m_k];
          dVar22 = this->m_loK;
          (*(this->super_PostStep)._vptr_PostStep[7])(this);
          bVar7 = GErel<double,double,double>(local_a8,dVar16 * dVar20 + dVar22,eps_08);
          if (bVar7) {
            local_a8 = this->m_upJ;
            pdVar10 = (double *)infinity();
            if (local_a8 < *pdVar10) goto LAB_001f57b9;
          }
          dVar16 = this->m_scale;
          dVar20 = this->m_upJ;
          local_a8 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[this->m_k];
          dVar22 = this->m_loK;
          (*(this->super_PostStep)._vptr_PostStep[7])(this);
          bVar7 = GErel<double,double,double>(local_a8,dVar16 * dVar20 + dVar22,eps_09);
          if (bVar7) {
            local_a8 = this->m_loK;
            pdVar10 = (double *)infinity();
            if (-*pdVar10 < local_a8) goto LAB_001f5718;
          }
          local_a8 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[this->m_k];
          local_88._0_8_ = this->m_scale * this->m_upJ + this->m_loK;
          (*(this->super_PostStep)._vptr_PostStep[7])(this);
          bVar7 = LTrel<double,double,double>(local_a8,(double)local_88._0_8_,eps_10);
          if (!bVar7) {
            pSVar11 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
            std::__cxx11::string::string
                      ((string *)&local_78,"XMAISM09 This should never happen.",&local_a9);
            SPxInternalCodeException::SPxInternalCodeException(pSVar11,&local_78);
            __cxa_throw(pSVar11,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
          }
          goto LAB_001f57b9;
        }
      }
LAB_001f5339:
      dVar16 = this->m_loJ;
      lVar15 = (long)this->m_j;
      cStatus->data[lVar15] = (this->m_upJ == dVar16) + ON_LOWER;
    }
    else {
      local_98 = this->m_upK + dVar16 * this->m_upJ;
      (*(this->super_PostStep)._vptr_PostStep[7])(this);
      bVar7 = GErel<double,double,double>(dVar20,local_98,eps);
      if (!bVar7) {
        dVar16 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[this->m_k];
        local_98 = this->m_scale * this->m_upJ + this->m_loK;
        (*(this->super_PostStep)._vptr_PostStep[7])(this);
        bVar7 = GErel<double,double,double>(dVar16,local_98,eps_00);
        if ((!bVar7) || (dVar16 = this->m_upJ, pdVar10 = (double *)infinity(), *pdVar10 <= dVar16))
        {
          dVar16 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[this->m_k];
          local_98 = this->m_scale * this->m_loJ + this->m_upK;
          (*(this->super_PostStep)._vptr_PostStep[7])(this);
          bVar7 = GErel<double,double,double>(dVar16,local_98,eps_01);
          if ((bVar7) && (dVar16 = this->m_upK, pdVar10 = (double *)infinity(), dVar16 < *pdVar10))
          {
LAB_001f55dc:
            dVar16 = this->m_upK;
            iVar1 = this->m_k;
            pVVar12 = cStatus->data;
            pVVar12[iVar1] = (-(uint)(this->m_loK == dVar16) & 1) * 2;
            pdVar13 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pdVar13[iVar1] = dVar16;
            lVar15 = (long)this->m_j;
            pVVar12[lVar15] = BASIC;
            pdVar13[lVar15] = (local_a8 * local_48) / this->m_scale;
            goto LAB_001f57fd;
          }
          dVar16 = this->m_scale;
          dVar20 = this->m_loJ;
          local_a8 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[this->m_k];
          dVar22 = this->m_loK;
          (*(this->super_PostStep)._vptr_PostStep[7])(this);
          bVar7 = GErel<double,double,double>(local_a8,dVar16 * dVar20 + dVar22,eps_02);
          if (bVar7) {
            local_a8 = this->m_loJ;
            pdVar10 = (double *)infinity();
            if (-*pdVar10 < local_a8) goto LAB_001f5339;
          }
          dVar16 = this->m_scale;
          dVar20 = this->m_loJ;
          local_a8 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[this->m_k];
          dVar22 = this->m_loK;
          (*(this->super_PostStep)._vptr_PostStep[7])(this);
          bVar7 = GErel<double,double,double>(local_a8,dVar16 * dVar20 + dVar22,eps_03);
          if (bVar7) {
            local_a8 = this->m_loK;
            pdVar10 = (double *)infinity();
            if (-*pdVar10 < local_a8) {
LAB_001f5718:
              dVar16 = this->m_loK;
              iVar1 = this->m_k;
              pVVar12 = cStatus->data;
              pVVar12[iVar1] = (this->m_upK == dVar16) + ON_LOWER;
              pdVar13 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
              pdVar13[iVar1] = dVar16;
              lVar15 = (long)this->m_j;
              pVVar12[lVar15] = BASIC;
              pdVar13[lVar15] = ((double)local_88._0_8_ * local_58) / this->m_scale;
              goto LAB_001f57fd;
            }
          }
          local_a8 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[this->m_k];
          local_88._0_8_ = this->m_scale * this->m_loJ + this->m_loK;
          (*(this->super_PostStep)._vptr_PostStep[7])(this);
          bVar7 = LTrel<double,double,double>(local_a8,(double)local_88._0_8_,eps_04);
          if (!bVar7) {
            pSVar11 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
            std::__cxx11::string::string
                      ((string *)&local_78,"XMAISM08 This should never happen.",&local_a9);
            SPxInternalCodeException::SPxInternalCodeException(pSVar11,&local_78);
            __cxa_throw(pSVar11,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
          }
          goto LAB_001f5339;
        }
      }
LAB_001f57b9:
      dVar16 = this->m_upJ;
      lVar15 = (long)this->m_j;
      cStatus->data[lVar15] = (-(uint)(this->m_loJ == dVar16) & 1) * 2;
    }
    pdVar13 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar13[lVar15] = dVar16;
    pdVar13[this->m_k] = pdVar13[this->m_k] - dVar16 * this->m_scale;
    goto LAB_001f57fd;
  default:
    lVar15 = (long)this->m_j;
    goto LAB_001f57fd;
  }
  dVar16 = this->m_upJ;
  pdVar13[lVar15] = dVar16;
  pVVar12[lVar15] = (-(uint)(dVar16 == this->m_loJ) & 1) * 2;
LAB_001f57fd:
  pdVar13 = (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  pdVar13[lVar15] = this->m_scale * pdVar13[this->m_k];
  return;
}

Assistant:

void SPxMainSM<R>::DuplicateColsPS::execute(VectorBase<R>& x,
      VectorBase<R>&,
      VectorBase<R>&,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{

   if(m_isFirst)
   {
#ifdef SOPLEX_CHECK_BASIS_DIM

      if(!this->checkBasisDim(rStatus, cStatus))
      {
         throw SPxInternalCodeException("XMAISM25 Dimension doesn't match after this step.");
      }

#endif
      return;
   }


   // correcting the change of idx by deletion of the columns:
   if(m_isLast)
   {
      for(int i = m_perm.size() - 1; i >= 0; --i)
      {
         if(m_perm[i] >= 0)
         {
            int cIdx_new = m_perm[i];
            int cIdx = i;
            x[cIdx] = x[cIdx_new];
            r[cIdx] = r[cIdx_new];
            cStatus[cIdx] = cStatus[cIdx_new];
         }
      }

      return;
   }

   // primal & basis:
   SOPLEX_ASSERT_WARN("WMAISM03", isNotZero(m_scale, this->epsilon()));

   if(cStatus[m_k] == SPxSolverBase<R>::ON_LOWER)
   {
      x[m_k] = m_loK;

      if(m_scale > 0)
      {
         x[m_j]       = m_loJ;
         cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
      }
      else
      {
         x[m_j]       = m_upJ;
         cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
      }
   }
   else if(cStatus[m_k] == SPxSolverBase<R>::ON_UPPER)
   {
      x[m_k] = m_upK;

      if(m_scale > 0)
      {
         x[m_j]       = m_upJ;
         cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
      }
      else
      {
         x[m_j]       = m_loJ;
         cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
      }
   }
   else if(cStatus[m_k] == SPxSolverBase<R>::FIXED)
   {
      // => x[m_k] and x[m_j] are also fixed before the corresponding preprocessing step
      x[m_j]       = m_loJ;
      cStatus[m_j] = SPxSolverBase<R>::FIXED;
   }
   else if(cStatus[m_k] == SPxSolverBase<R>::ZERO)
   {
      /* we only aggregate duplicate columns if 0 is contained in their bounds, so we can handle this case properly */
      assert(isZero(x[m_k], this->epsilon()));
      assert(LErel(m_loJ, R(0.0), this->epsilon()));
      assert(GErel(m_upJ, R(0.0), this->epsilon()));
      assert(LErel(m_loK, R(0.0), this->epsilon()));
      assert(GErel(m_upK, R(0.0), this->epsilon()));

      if(isZero(m_loK, this->epsilon()) && isZero(m_upK, this->epsilon()) && m_loK == m_upK)
         cStatus[m_k] = SPxSolverBase<R>::FIXED;
      else if(isZero(m_loK, this->epsilon()))
         cStatus[m_k] = SPxSolverBase<R>::ON_LOWER;
      else if(isZero(m_upK, this->epsilon()))
         cStatus[m_k] = SPxSolverBase<R>::ON_UPPER;
      else if(LErel(m_loK, R(0.0), this->epsilon()) && GErel(m_upK, R(0.0), this->epsilon()))
         cStatus[m_k] = SPxSolverBase<R>::ZERO;
      else
         throw SPxInternalCodeException("XMAISM05 This should never happen.");

      x[m_j] = 0.0;

      if(isZero(m_loJ, this->epsilon()) && isZero(m_upJ, this->epsilon()) && m_loJ == m_upJ)
         cStatus[m_j] = SPxSolverBase<R>::FIXED;
      else if(isZero(m_loJ, this->epsilon()))
         cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
      else if(isZero(m_upJ, this->epsilon()))
         cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      else if(LErel(m_loJ, R(0.0), this->epsilon()) && GErel(m_upJ, R(0.0), this->epsilon()))
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
      else
         throw SPxInternalCodeException("XMAISM06 This should never happen.");
   }
   else if(cStatus[m_k] == SPxSolverBase<R>::BASIC)
   {
      R scale1 = maxAbs(x[m_k], m_loK);
      R scale2 = maxAbs(x[m_k], m_upK);

      if(scale1 < 1.0)
         scale1 = 1.0;

      if(scale2 < 1.0)
         scale2 = 1.0;

      R z1 = (x[m_k] / scale1) - (m_loK / scale1);
      R z2 = (x[m_k] / scale2) - (m_upK / scale2);

      if(isZero(z1, this->epsilon()))
         z1 = 0.0;

      if(isZero(z2, this->epsilon()))
         z2 = 0.0;

      if(m_loJ <= R(-infinity) && m_upJ >= R(infinity) && m_loK <= R(-infinity) && m_upK >= R(infinity))
      {
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
         x[m_j] = 0.0;
      }
      else if(m_scale > 0.0)
      {
         if(GErel(x[m_k], m_upK + m_scale * m_upJ, this->epsilon()))
         {
            assert(m_upJ < R(infinity));
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_j] = m_upJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_upJ, this->epsilon()) && m_upJ < R(infinity))
         {
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_j] = m_upJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_upK + m_scale * m_loJ, this->epsilon()) && m_upK < R(infinity))
         {
            cStatus[m_k] = (m_loK == m_upK) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_k] = m_upK;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            x[m_j] = z2 * scale2 / m_scale;
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_loJ, this->epsilon()) && m_loJ > R(-infinity))
         {
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_j] = m_loJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_loJ, this->epsilon()) && m_loK > R(-infinity))
         {
            cStatus[m_k] = (m_loK == m_upK) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_k] = m_loK;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            x[m_j] = z1 * scale1 / m_scale;
         }
         else if(LTrel(x[m_k], m_loK + m_scale * m_loJ, this->epsilon()))
         {
            assert(m_loJ > R(-infinity));
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_j] = m_loJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else
         {
            throw SPxInternalCodeException("XMAISM08 This should never happen.");
         }
      }
      else
      {
         assert(m_scale < 0.0);

         if(GErel(x[m_k], m_upK + m_scale * m_loJ, this->epsilon()))
         {
            assert(m_loJ > R(-infinity));
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_j] = m_loJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_loJ, this->epsilon()) && m_loJ > R(-infinity))
         {
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_j] = m_loJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_upK + m_scale * m_upJ, this->epsilon()) && m_upK < R(infinity))
         {
            cStatus[m_k] = (m_loK == m_upK) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_k] = m_upK;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            x[m_j] = z2 * scale2 / m_scale;
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_upJ, this->epsilon()) && m_upJ < R(infinity))
         {
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_j] = m_upJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_upJ, this->epsilon()) && m_loK > R(-infinity))
         {
            cStatus[m_k] = (m_loK == m_upK) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_k] = m_loK;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            x[m_j] = z1 * scale1 / m_scale;
         }
         else if(LTrel(x[m_k], m_loK + m_scale * m_upJ, this->epsilon()))
         {
            assert(m_upJ < R(infinity));
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_j] = m_upJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else
         {
            throw SPxInternalCodeException("XMAISM09 This should never happen.");
         }
      }
   }

   // dual:
   r[m_j] = m_scale * r[m_k];
}